

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)3>::do_update
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)3> *this)

{
  sc_signal_channel *in_RDI;
  
  sc_signal_channel::do_update(in_RDI);
  *(byte *)&in_RDI[1].super_sc_prim_channel.super_sc_object.m_child_events.
            super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
            super__Vector_impl_data._M_start =
       *(byte *)((long)&in_RDI[1].super_sc_prim_channel.super_sc_object.m_child_events.
                        super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1) & 1;
  return;
}

Assistant:

inline void
sc_signal_t<T,POL>::do_update()
{
    base_type::do_update();
    m_cur_val = m_new_val;
}